

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  int number;
  Type TVar1;
  uint32 uVar2;
  Descriptor *message_type;
  MessageLite *pMVar3;
  Message **ppMVar4;
  Message *pMVar5;
  long *plVar6;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage",
               "Field is repeated; the method requires a singular field.");
  }
  TVar1 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    message_type = FieldDescriptor::message_type(field);
    pMVar3 = ExtensionSet::GetMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        number,message_type,factory);
    return (Message *)pMVar3;
  }
  ppMVar4 = GetRaw<google::protobuf::Message_const*>(this,message,field);
  pMVar5 = *ppMVar4;
  if (pMVar5 == (Message *)0x0) {
    if (field[0x50] == (FieldDescriptor)0x0) {
      plVar6 = (long *)(*(long *)(field + 0x58) + 0x30);
    }
    else if (*(long *)(field + 0x68) == 0) {
      plVar6 = (long *)(*(long *)(field + 0x30) + 0x98);
    }
    else {
      plVar6 = (long *)(*(long *)(field + 0x68) + 0x80);
    }
    pMVar5 = *(Message **)
              ((long)&(((this->schema_).default_instance_)->super_MessageLite)._vptr_MessageLite +
              (ulong)(this->schema_).offsets_
                     [(int)((ulong)((long)field - *plVar6) >> 3) * 0x3cf3cf3d]);
  }
  return pMVar5;
}

Assistant:

const Message& GeneratedMessageReflection::GetMessage(
    const Message& message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetMessage(
          field->number(), field->message_type(), factory));
  } else {
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == NULL) {
      result = DefaultRaw<const Message*>(field);
    }
    return *result;
  }
}